

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

void lyd_insert_setinvalid(lyd_node *node)

{
  lyd_node **pplVar1;
  LYS_NODE LVar2;
  lyd_node *plVar3;
  lys_node *plVar4;
  lyd_node *plVar5;
  int iVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xcc0,"void lyd_insert_setinvalid(struct lyd_node *)");
  }
  iVar6 = ly_new_node_validity(node->schema);
  node->validity = (uint8_t)iVar6;
  plVar3 = node->parent;
  plVar7 = plVar3;
  if (plVar3 != (lyd_node *)0x0) {
    do {
      if (plVar7->schema->nodetype == LYS_LIST) {
        plVar5 = node;
        if ((plVar7->validity & 1) == 0) goto LAB_0015fa98;
        break;
      }
      pplVar1 = &plVar7->parent;
      plVar7 = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
LAB_0015fafb:
    if (plVar3 != (lyd_node *)0x0) {
      plVar4 = node->schema;
      if ((plVar4->nodetype & LYS_LEAFLIST) == LYS_UNKNOWN) {
        if ((plVar4->nodetype & LYS_LIST) == LYS_UNKNOWN) {
          return;
        }
        iVar6 = *(int *)((long)&plVar4[1].iffeature + 4);
      }
      else {
        iVar6 = *(int *)((long)&plVar4[1].priv + 4);
      }
      if (iVar6 != 0) {
        plVar3->validity = plVar3->validity | 2;
      }
    }
  }
  return;
LAB_0015fa98:
  do {
    do {
      plVar8 = plVar5;
      LVar2 = plVar8->schema->nodetype;
      if (LVar2 == LYS_LIST) break;
      if (LVar2 == LYS_LEAF) {
        if ((plVar8->schema->flags & 0x100) == 0) {
LAB_0015fabf:
          if (plVar8 != node) break;
        }
        else {
          plVar7->validity = plVar7->validity | 1;
        }
        goto LAB_0015fafb;
      }
      if ((LVar2 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) goto LAB_0015fabf;
      plVar5 = plVar8->child;
    } while (plVar8->child != (lyd_node *)0x0);
    plVar5 = plVar8->next;
  } while (plVar8->next != (lyd_node *)0x0);
  if (plVar8 == node) goto LAB_0015fafb;
  plVar8 = plVar8->parent;
  do {
    plVar8 = plVar8->parent;
    if (plVar8 == plVar3) goto LAB_0015fafb;
    plVar5 = plVar8->next;
  } while (plVar8->next == (lyd_node *)0x0);
  goto LAB_0015fa98;
}

Assistant:

static void
lyd_insert_setinvalid(struct lyd_node *node)
{
    struct lyd_node *next, *elem, *parent_list;

    assert(node);

    /* overall validity of the node itself */
    node->validity = ly_new_node_validity(node->schema);

    /* explore changed unique leaves */
    /* first, get know if there is a list in parents chain */
    for (parent_list = node->parent;
         parent_list && parent_list->schema->nodetype != LYS_LIST;
         parent_list = parent_list->parent);
    if (parent_list && !(parent_list->validity & LYD_VAL_UNIQUE)) {
        /* there is a list, so check if we inserted a leaf supposed to be unique */
        for (elem = node; elem; elem = next) {
            if (elem->schema->nodetype == LYS_LIST) {
                /* stop searching to the depth, children would be unique to a list in subtree */
                goto nextsibling;
            }

            if (elem->schema->nodetype == LYS_LEAF && (elem->schema->flags & LYS_UNIQUE)) {
                /* set flag to list for future validation */
                parent_list->validity |= LYD_VAL_UNIQUE;
                break;
            }

            if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                if (elem == node) {
                    /* stop the loop */
                    break;
                }
                goto nextsibling;
            }

            /* select next elem to process */
            /* go into children */
            next = elem->child;
            /* go through siblings */
            if (!next) {
nextsibling:
                next = elem->next;
                if (!next) {
                    /* no sibling */
                    if (elem == node) {
                        /* we are done, back in start node */
                        break;
                    }
                }
            }
            /* go back to parents */
            while (!next) {
                elem = elem->parent;
                if (elem->parent == node->parent) {
                    /* we are done, back in start node */
                    break;
                }
                /* parent was actually already processed, so go to the parent's sibling */
                next = elem->parent->next;
            }
        }
    }

    if (node->parent) {
        /* if the inserted node is list/leaflist with constraint on max instances,
         * invalidate the parent to make it validate this */
        if (node->schema->nodetype & LYS_LEAFLIST) {
            if (((struct lys_node_leaflist *)node->schema)->max) {
                node->parent->validity |= LYD_VAL_MAND;
            }
        } else if (node->schema->nodetype & LYS_LIST) {
            if (((struct lys_node_list *)node->schema)->max) {
                node->parent->validity |= LYD_VAL_MAND;
            }
        }
    }
}